

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lf_function_queue.h
# Opt level: O0

optional<double> __thiscall
density::
lf_function_queue<double_(),_density::basic_default_allocator<65536UL>,_(density::function_type_erasure)1,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)1,_(density::consistency_model)1>
::try_consume_impl(lf_function_queue<double_(),_density::basic_default_allocator<65536UL>,_(density::function_type_erasure)1,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)1,_(density::consistency_model)1>
                   *this,lf_heter_queue<density::detail::FunctionRuntimeType<(density::function_type_erasure)1,_double_()>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)1,_(density::consistency_model)1>
                         *param_2)

{
  bool bVar1;
  FunctionRuntimeType<(density::function_type_erasure)1,_double_()> *this_00;
  void *i_dest;
  undefined8 extraout_RDX;
  optional<double> oVar2;
  double local_48;
  double *local_40;
  double *result;
  consume_operation cons;
  lf_function_queue<double_(),_density::basic_default_allocator<65536UL>,_(density::function_type_erasure)1,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)1,_(density::consistency_model)1>
  *this_local;
  
  cons.m_consume_data.m_next_ptr = (uintptr_t)param_2;
  lf_heter_queue<density::detail::FunctionRuntimeType<(density::function_type_erasure)1,_double_()>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)1,_(density::consistency_model)1>
  ::try_start_consume((consume_operation *)&result,param_2);
  bVar1 = density::lf_heter_queue::consume_operation::operator_cast_to_bool
                    ((consume_operation *)&result);
  if (bVar1) {
    this_00 = lf_heter_queue<density::detail::FunctionRuntimeType<(density::function_type_erasure)1,_double_()>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)1,_(density::consistency_model)1>
              ::consume_operation::complete_type((consume_operation *)&result);
    i_dest = lf_heter_queue<density::detail::FunctionRuntimeType<(density::function_type_erasure)1,_double_()>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)1,_(density::consistency_model)1>
             ::consume_operation::unaligned_element_ptr((consume_operation *)&result);
    local_48 = detail::FunctionRuntimeType<(density::function_type_erasure)1,_double_()>::
               align_invoke_destroy(this_00,i_dest);
    local_40 = &local_48;
    lf_heter_queue<density::detail::FunctionRuntimeType<(density::function_type_erasure)1,_double_()>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)1,_(density::consistency_model)1>
    ::consume_operation::commit_nodestroy((consume_operation *)&result);
    builtin_optional<double>::builtin_optional<double>((builtin_optional<double> *)this,local_40);
  }
  else {
    memset(this,0,0x10);
    builtin_optional<double>::builtin_optional((builtin_optional<double> *)this);
  }
  lf_heter_queue<density::detail::FunctionRuntimeType<(density::function_type_erasure)1,_double_()>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)1,_(density::consistency_model)1>
  ::consume_operation::~consume_operation((consume_operation *)&result);
  oVar2._8_8_ = extraout_RDX;
  oVar2.m_storage = (type)this;
  return oVar2;
}

Assistant:

optional<RET_VAL> try_consume_impl(std::false_type, PARAMS... i_params)
        {
            if (auto cons = m_queue.try_start_consume())
            {
                auto && result = cons.complete_type().align_invoke_destroy(
                  cons.unaligned_element_ptr(), std::forward<PARAMS>(i_params)...);
                cons.commit_nodestroy();
                return optional<RET_VAL>(std::move(result));
            }
            else
            {
                return optional<RET_VAL>();
            }
        }